

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parsePostIncDec(StructuralParser *this,Expression *lhs,bool isIncrement)

{
  PreOrPostIncOrDec *pPVar1;
  bool local_3a;
  bool local_39;
  Context local_38;
  
  local_39 = isIncrement;
  getContext(&local_38,this);
  local_3a = true;
  pPVar1 = allocate<soul::AST::PreOrPostIncOrDec,soul::AST::Context,soul::AST::Expression&,bool&,bool>
                     (this,&local_38,lhs,&local_39,&local_3a);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_38);
  return &pPVar1->super_Expression;
}

Assistant:

AST::Expression& parsePostIncDec (AST::Expression& lhs, bool isIncrement)
    {
        return allocate<AST::PreOrPostIncOrDec> (getContext(), lhs, isIncrement, true);
    }